

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IteratorSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation_const&,slang::ast::DynamicArrayType&,std::basic_string_view<char,std::char_traits<char>>>
          (BumpAllocator *this,Scope *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          SourceLocation *args_2,DynamicArrayType *args_3,
          basic_string_view<char,_std::char_traits<char>_> *args_4)

{
  string_view name;
  string_view indexMethodName;
  IteratorSymbol *pIVar1;
  char *in_RCX;
  undefined8 *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t in_R8;
  SourceLocation in_R9;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pIVar1 = (IteratorSymbol *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  name._M_str = in_RCX;
  name._M_len = in_R8;
  indexMethodName._M_str = in_RDI;
  indexMethodName._M_len = in_RSI;
  slang::ast::IteratorSymbol::IteratorSymbol
            ((IteratorSymbol *)in_RDX[1],(Scope *)*in_RDX,name,in_R9,*(Type **)in_RCX,
             indexMethodName);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }